

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_enc.c
# Opt level: O3

void VP8SetIntra16Mode(VP8EncIterator *it,int mode)

{
  int *piVar1;
  int iVar2;
  
  piVar1 = (int *)it->preds;
  iVar2 = 4;
  do {
    *piVar1 = (mode & 0xffU) * 0x1010101;
    piVar1 = (int *)((long)piVar1 + (long)it->enc->preds_w);
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  *(byte *)it->mb = (*(byte *)it->mb & 0xfc) + 1;
  return;
}

Assistant:

void VP8SetIntra16Mode(const VP8EncIterator* const it, int mode) {
  uint8_t* preds = it->preds;
  int y;
  for (y = 0; y < 4; ++y) {
    memset(preds, mode, 4);
    preds += it->enc->preds_w;
  }
  it->mb->type = 1;
}